

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::UpdateHoveredWindowAndCaptureFlags(void)

{
  ImVec2 *pIVar1;
  ImGuiWindow **ppIVar2;
  double *pdVar3;
  float fVar4;
  float fVar5;
  double dVar6;
  uint uVar7;
  ImGuiContext *pIVar8;
  ImGuiWindow *pIVar9;
  byte bVar10;
  ImGuiContext *g;
  byte bVar11;
  ImVec2 IVar12;
  byte bVar13;
  int iVar14;
  long lVar15;
  float fVar16;
  float fVar17;
  ImGuiWindow *pIVar18;
  bool bVar19;
  undefined1 auVar20 [16];
  
  pIVar8 = GImGui;
  pIVar18 = GImGui->MovingWindow;
  pIVar9 = (ImGuiWindow *)0x0;
  if ((pIVar18 != (ImGuiWindow *)0x0) && ((pIVar18->Flags & 0x200) == 0)) {
    pIVar9 = pIVar18;
  }
  pIVar1 = &(GImGui->Style).TouchExtraPadding;
  IVar12 = *pIVar1;
  if ((GImGui->IO).ConfigWindowsResizeFromEdges == true) {
    auVar20._8_8_ = 0;
    auVar20._0_4_ = (GImGui->Style).TouchExtraPadding.x;
    auVar20._4_4_ = (GImGui->Style).TouchExtraPadding.y;
    auVar20 = maxps(auVar20,_DAT_001980f0);
    IVar12 = auVar20._0_8_;
  }
  lVar15 = (long)(GImGui->Windows).Size;
  if (0 < lVar15) {
    lVar15 = lVar15 + 1;
    do {
      pIVar18 = (GImGui->Windows).Data[lVar15 + -2];
      bVar19 = false;
      if (((pIVar18->Active == true) && (pIVar18->Hidden == false)) &&
         (uVar7 = pIVar18->Flags, (uVar7 >> 9 & 1) == 0)) {
        fVar16 = IVar12.x;
        if ((uVar7 & 0x1000042) != 0) {
          fVar16 = pIVar1->x;
        }
        fVar4 = (GImGui->IO).MousePos.x;
        if ((pIVar18->OuterRectClipped).Min.x - fVar16 <= fVar4) {
          fVar17 = IVar12.y;
          if ((uVar7 & 0x1000042) != 0) {
            fVar17 = (GImGui->Style).TouchExtraPadding.y;
          }
          fVar5 = (GImGui->IO).MousePos.y;
          if ((((pIVar18->OuterRectClipped).Min.y - fVar17 <= fVar5) &&
              (fVar4 < fVar16 + (pIVar18->OuterRectClipped).Max.x)) &&
             (fVar5 < fVar17 + (pIVar18->OuterRectClipped).Max.y)) {
            if (pIVar9 == (ImGuiWindow *)0x0) {
              pIVar9 = pIVar18;
            }
            bVar19 = pIVar9 != (ImGuiWindow *)0x0;
          }
        }
      }
    } while ((!bVar19) && (lVar15 = lVar15 + -1, 1 < lVar15));
  }
  GImGui->HoveredWindow = pIVar9;
  if (pIVar9 == (ImGuiWindow *)0x0) {
    pIVar18 = (ImGuiWindow *)0x0;
  }
  else {
    pIVar18 = pIVar9->RootWindow;
  }
  ppIVar2 = &pIVar8->HoveredWindow;
  pIVar8->HoveredRootWindow = pIVar18;
  pIVar9 = GetTopMostPopupModal();
  if (((pIVar9 != (ImGuiWindow *)0x0) && (pIVar18 != (ImGuiWindow *)0x0)) &&
     (pIVar18->RootWindow != pIVar9)) {
    do {
      if (pIVar18 == pIVar9) goto LAB_0015088b;
      pIVar18 = pIVar18->ParentWindow;
    } while (pIVar18 != (ImGuiWindow *)0x0);
    *ppIVar2 = (ImGuiWindow *)0x0;
    pIVar8->HoveredRootWindow = (ImGuiWindow *)0x0;
  }
LAB_0015088b:
  uVar7 = (pIVar8->IO).ConfigFlags;
  if ((uVar7 & 0x10) != 0) {
    *ppIVar2 = (ImGuiWindow *)0x0;
    pIVar8->HoveredRootWindow = (ImGuiWindow *)0x0;
  }
  iVar14 = -1;
  lVar15 = 0;
  bVar10 = 0;
  do {
    if ((pIVar8->IO).MouseClicked[lVar15] == true) {
      bVar19 = true;
      if (*ppIVar2 == (ImGuiWindow *)0x0) {
        bVar19 = (pIVar8->OpenPopupStack).Size != 0;
      }
      (pIVar8->IO).MouseDownOwned[lVar15] = bVar19;
    }
    bVar19 = (pIVar8->IO).MouseDown[lVar15];
    if ((bVar19 == true) &&
       ((iVar14 == -1 ||
        (dVar6 = (pIVar8->IO).MouseClickedTime[iVar14],
        pdVar3 = (pIVar8->IO).MouseClickedTime + lVar15, *pdVar3 <= dVar6 && dVar6 != *pdVar3)))) {
      iVar14 = (int)lVar15;
    }
    bVar10 = bVar10 & 1 | bVar19;
    lVar15 = lVar15 + 1;
  } while (lVar15 != 5);
  if (iVar14 == -1) {
    bVar11 = 1;
  }
  else {
    bVar11 = (pIVar8->IO).MouseDownOwned[iVar14];
  }
  if (pIVar8->DragDropActive == true) {
    bVar13 = ((byte)pIVar8->DragDropSourceFlags & 0x10) >> 4;
  }
  else {
    bVar13 = 0;
  }
  if (bVar13 == 0 && (bVar11 & 1) == 0) {
    *ppIVar2 = (ImGuiWindow *)0x0;
    pIVar8->HoveredRootWindow = (ImGuiWindow *)0x0;
  }
  if (pIVar8->WantCaptureMouseNextFrame == -1) {
    if ((bVar11 == 0) || ((bVar19 = true, *ppIVar2 == (ImGuiWindow *)0x0 && (bVar10 == 0)))) {
      bVar19 = (pIVar8->OpenPopupStack).Size != 0;
    }
    (pIVar8->IO).WantCaptureMouse = bVar19;
  }
  else {
    (pIVar8->IO).WantCaptureMouse = pIVar8->WantCaptureMouseNextFrame != 0;
  }
  if (pIVar8->WantCaptureKeyboardNextFrame == -1) {
    bVar19 = pIVar8->ActiveId != 0 || pIVar9 != (ImGuiWindow *)0x0;
  }
  else {
    bVar19 = pIVar8->WantCaptureKeyboardNextFrame != 0;
  }
  (pIVar8->IO).WantCaptureKeyboard = bVar19;
  if (((uVar7 & 9) == 1) && ((pIVar8->IO).NavActive != false)) {
    (pIVar8->IO).WantCaptureKeyboard = true;
  }
  (pIVar8->IO).WantTextInput = pIVar8->WantTextInputNextFrame - 1U < 0xfffffffe;
  return;
}

Assistant:

void ImGui::UpdateHoveredWindowAndCaptureFlags()
{
    ImGuiContext& g = *GImGui;

    // Find the window hovered by mouse:
    // - Child windows can extend beyond the limit of their parent so we need to derive HoveredRootWindow from HoveredWindow.
    // - When moving a window we can skip the search, which also conveniently bypasses the fact that window->WindowRectClipped is lagging as this point of the frame.
    // - We also support the moved window toggling the NoInputs flag after moving has started in order to be able to detect windows below it, which is useful for e.g. docking mechanisms.
    FindHoveredWindow();

    // Modal windows prevents cursor from hovering behind them.
    ImGuiWindow* modal_window = GetTopMostPopupModal();
    if (modal_window)
        if (g.HoveredRootWindow && !IsWindowChildOf(g.HoveredRootWindow, modal_window))
            g.HoveredRootWindow = g.HoveredWindow = NULL;

    // Disabled mouse?
    if (g.IO.ConfigFlags & ImGuiConfigFlags_NoMouse)
        g.HoveredWindow = g.HoveredRootWindow = NULL;

    // We track click ownership. When clicked outside of a window the click is owned by the application and won't report hovering nor request capture even while dragging over our windows afterward.
    int mouse_earliest_button_down = -1;
    bool mouse_any_down = false;
    for (int i = 0; i < IM_ARRAYSIZE(g.IO.MouseDown); i++)
    {
        if (g.IO.MouseClicked[i])
            g.IO.MouseDownOwned[i] = (g.HoveredWindow != NULL) || (!g.OpenPopupStack.empty());
        mouse_any_down |= g.IO.MouseDown[i];
        if (g.IO.MouseDown[i])
            if (mouse_earliest_button_down == -1 || g.IO.MouseClickedTime[i] < g.IO.MouseClickedTime[mouse_earliest_button_down])
                mouse_earliest_button_down = i;
    }
    const bool mouse_avail_to_imgui = (mouse_earliest_button_down == -1) || g.IO.MouseDownOwned[mouse_earliest_button_down];

    // If mouse was first clicked outside of ImGui bounds we also cancel out hovering.
    // FIXME: For patterns of drag and drop across OS windows, we may need to rework/remove this test (first committed 311c0ca9 on 2015/02)
    const bool mouse_dragging_extern_payload = g.DragDropActive && (g.DragDropSourceFlags & ImGuiDragDropFlags_SourceExtern) != 0;
    if (!mouse_avail_to_imgui && !mouse_dragging_extern_payload)
        g.HoveredWindow = g.HoveredRootWindow = NULL;

    // Update io.WantCaptureMouse for the user application (true = dispatch mouse info to imgui, false = dispatch mouse info to Dear ImGui + app)
    if (g.WantCaptureMouseNextFrame != -1)
        g.IO.WantCaptureMouse = (g.WantCaptureMouseNextFrame != 0);
    else
        g.IO.WantCaptureMouse = (mouse_avail_to_imgui && (g.HoveredWindow != NULL || mouse_any_down)) || (!g.OpenPopupStack.empty());

    // Update io.WantCaptureKeyboard for the user application (true = dispatch keyboard info to imgui, false = dispatch keyboard info to Dear ImGui + app)
    if (g.WantCaptureKeyboardNextFrame != -1)
        g.IO.WantCaptureKeyboard = (g.WantCaptureKeyboardNextFrame != 0);
    else
        g.IO.WantCaptureKeyboard = (g.ActiveId != 0) || (modal_window != NULL);
    if (g.IO.NavActive && (g.IO.ConfigFlags & ImGuiConfigFlags_NavEnableKeyboard) && !(g.IO.ConfigFlags & ImGuiConfigFlags_NavNoCaptureKeyboard))
        g.IO.WantCaptureKeyboard = true;

    // Update io.WantTextInput flag, this is to allow systems without a keyboard (e.g. mobile, hand-held) to show a software keyboard if possible
    g.IO.WantTextInput = (g.WantTextInputNextFrame != -1) ? (g.WantTextInputNextFrame != 0) : false;
}